

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O3

void __thiscall ON_XMLNode::RemoveAllProperties(ON_XMLNode *this)

{
  int iVar1;
  undefined4 extraout_var;
  recursive_mutex *__mutex;
  ON_XMLProperty *pDelete;
  ON_XMLProperty *pOVar2;
  ON_XMLNodePrivate *this_00;
  
  __mutex = &this->_private->m_mutex;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar1 == 0) {
    this_00 = this->_private;
    pOVar2 = this_00->m_first_property;
    if (this_00->m_first_property != (ON_XMLProperty *)0x0) {
      do {
        iVar1 = (*pOVar2->_vptr_ON_XMLProperty[5])(pOVar2);
        (*pOVar2->_vptr_ON_XMLProperty[1])(pOVar2);
        pOVar2 = (ON_XMLProperty *)CONCAT44(extraout_var,iVar1);
      } while ((ON_XMLProperty *)CONCAT44(extraout_var,iVar1) != (ON_XMLProperty *)0x0);
      this_00->m_first_property = (ON_XMLProperty *)0x0;
      this_00 = this->_private;
    }
    ON_XMLNodePrivate::AddEmptyDefaultProperty(this_00);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void ON_XMLNode::RemoveAllProperties(void)
{
  std::lock_guard<std::recursive_mutex> lg(_private->m_mutex);

  _private->RemoveAllProperties();
  _private->AddEmptyDefaultProperty();
}